

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

attr_list attr_list_from_string(char *str)

{
  uchar *output_00;
  uchar *in_RDI;
  uchar *output;
  attr_list ret_val;
  void *in_stack_00000040;
  undefined8 local_8;
  
  if (in_RDI == (uchar *)0x0) {
    local_8 = (attr_list)0x0;
  }
  else {
    output_00 = (uchar *)strdup((char *)in_RDI);
    base64_decode(in_RDI,output_00);
    local_8 = decode_attr_from_xmit(in_stack_00000040);
    free(output_00);
  }
  return local_8;
}

Assistant:

extern
attr_list
attr_list_from_string(const char * str)
{
    attr_list ret_val;
    unsigned char *output;
    if (str == NULL) return NULL;

    output = (unsigned char *)strdup(str);
    base64_decode((unsigned char *)str, output);
    ret_val = decode_attr_from_xmit(output);
    free(output);
    return ret_val;
}